

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SamePadding * __thiscall
CoreML::Specification::ConvolutionLayerParams::mutable_same(ConvolutionLayerParams *this)

{
  bool bVar1;
  SamePadding *this_00;
  ConvolutionLayerParams *this_local;
  
  bVar1 = has_same(this);
  if (!bVar1) {
    clear_ConvolutionPaddingType(this);
    set_has_same(this);
    this_00 = (SamePadding *)operator_new(0x18);
    SamePadding::SamePadding(this_00);
    (this->ConvolutionPaddingType_).same_ = this_00;
  }
  return (SamePadding *)(this->ConvolutionPaddingType_).valid_;
}

Assistant:

inline ::CoreML::Specification::SamePadding* ConvolutionLayerParams::mutable_same() {
  if (!has_same()) {
    clear_ConvolutionPaddingType();
    set_has_same();
    ConvolutionPaddingType_.same_ = new ::CoreML::Specification::SamePadding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ConvolutionLayerParams.same)
  return ConvolutionPaddingType_.same_;
}